

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  pointer pnVar11;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  soplex *psVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  int iVar16;
  long in_FS_OFFSET;
  byte bVar17;
  int idx;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  int local_490;
  uint local_48c;
  Item *local_488;
  int local_480;
  int local_47c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_478;
  undefined8 uStack_470;
  DataKey local_460;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_458;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  soplex local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar17 = 0;
  local_490 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_480 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_458.up.m_backend.data._M_elems[0] = 0;
  local_458.up.m_backend.data._M_elems[1] = 0xffffffff;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)&local_458,row);
  local_488 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_490].idx;
  local_48c = 0;
  local_47c = (int)CONCAT71(in_register_00000011,scale);
  if ((local_47c != 0) &&
     (pSVar1 = this->lp_scaler,
     pSVar1 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0)) {
    local_48c = (*pSVar1->_vptr_SPxScaler[1])
                          (pSVar1,local_488,
                           &(this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar10 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_490].m_backend;
    ::soplex::infinity::__tls_init();
    local_478 = *(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    local_458.up.m_backend.fpclass = cpp_dec_float_finite;
    local_458.up.m_backend.prec_elem = 0x1c;
    local_458.up.m_backend.data._M_elems[0] = 0;
    local_458.up.m_backend.data._M_elems[1] = 0;
    local_458.up.m_backend.data._M_elems[2] = 0;
    local_458.up.m_backend.data._M_elems[3] = 0;
    local_458.up.m_backend.data._M_elems[4] = 0;
    local_458.up.m_backend.data._M_elems[5] = 0;
    local_458.up.m_backend.data._M_elems[6] = 0;
    local_458.up.m_backend.data._M_elems[7] = 0;
    local_458.up.m_backend.data._M_elems[8] = 0;
    local_458.up.m_backend.data._M_elems[9] = 0;
    local_458.up.m_backend.data._M_elems[10] = 0;
    local_458.up.m_backend.data._M_elems[0xb] = 0;
    local_458.up.m_backend.data._M_elems[0xc] = 0;
    local_458.up.m_backend.data._M_elems[0xd] = 0;
    local_458.up.m_backend.data._M_elems[0xe] = 0;
    local_458.up.m_backend.data._M_elems[0xf] = 0;
    local_458.up.m_backend.data._M_elems[0x10] = 0;
    local_458.up.m_backend.data._M_elems[0x11] = 0;
    local_458.up.m_backend.data._M_elems[0x12] = 0;
    local_458.up.m_backend.data._M_elems[0x13] = 0;
    local_458.up.m_backend.data._M_elems[0x14] = 0;
    local_458.up.m_backend.data._M_elems[0x15] = 0;
    local_458.up.m_backend.data._M_elems[0x16] = 0;
    local_458.up.m_backend.data._M_elems[0x17] = 0;
    local_458.up.m_backend.data._M_elems[0x18] = 0;
    local_458.up.m_backend.data._M_elems[0x19] = 0;
    local_458.up.m_backend.data._M_elems._104_5_ = 0;
    local_458.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_458.up.m_backend.exp = 0;
    local_458.up.m_backend.neg = false;
    uStack_470 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_458,(double)local_478);
    if ((pcVar10->fpclass != cpp_dec_float_NaN) &&
       ((local_458.up.m_backend.fpclass != cpp_dec_float_NaN &&
        (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar10,(cpp_dec_float<200U,_int,_void> *)&local_458), iVar6 < 0)))) {
      lVar9 = (long)local_490;
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar2 + lVar9;
      psVar14 = local_b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
      }
      local_40 = pnVar2[lVar9].m_backend.exp;
      local_3c = pnVar2[lVar9].m_backend.neg;
      local_38._0_4_ = pnVar2[lVar9].m_backend.fpclass;
      local_38._4_4_ = pnVar2[lVar9].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_458,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_48c,(undefined4)local_38);
      lVar7 = (long)local_490;
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar12 = &local_458;
      pnVar11 = pnVar2 + lVar7;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pLVar12->up).m_backend.data._M_elems[0];
        pLVar12 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar2[lVar7].m_backend.exp = local_458.up.m_backend.exp;
      pnVar2[lVar7].m_backend.neg = local_458.up.m_backend.neg;
      pnVar2[lVar7].m_backend.fpclass = local_458.up.m_backend.fpclass;
      pnVar2[lVar7].m_backend.prec_elem = local_458.up.m_backend.prec_elem;
    }
    pcVar10 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_490].m_backend;
    ::soplex::infinity::__tls_init();
    local_458.up.m_backend.fpclass = cpp_dec_float_finite;
    local_458.up.m_backend.prec_elem = 0x1c;
    local_458.up.m_backend.data._M_elems[0] = 0;
    local_458.up.m_backend.data._M_elems[1] = 0;
    local_458.up.m_backend.data._M_elems[2] = 0;
    local_458.up.m_backend.data._M_elems[3] = 0;
    local_458.up.m_backend.data._M_elems[4] = 0;
    local_458.up.m_backend.data._M_elems[5] = 0;
    local_458.up.m_backend.data._M_elems[6] = 0;
    local_458.up.m_backend.data._M_elems[7] = 0;
    local_458.up.m_backend.data._M_elems[8] = 0;
    local_458.up.m_backend.data._M_elems[9] = 0;
    local_458.up.m_backend.data._M_elems[10] = 0;
    local_458.up.m_backend.data._M_elems[0xb] = 0;
    local_458.up.m_backend.data._M_elems[0xc] = 0;
    local_458.up.m_backend.data._M_elems[0xd] = 0;
    local_458.up.m_backend.data._M_elems[0xe] = 0;
    local_458.up.m_backend.data._M_elems[0xf] = 0;
    local_458.up.m_backend.data._M_elems[0x10] = 0;
    local_458.up.m_backend.data._M_elems[0x11] = 0;
    local_458.up.m_backend.data._M_elems[0x12] = 0;
    local_458.up.m_backend.data._M_elems[0x13] = 0;
    local_458.up.m_backend.data._M_elems[0x14] = 0;
    local_458.up.m_backend.data._M_elems[0x15] = 0;
    local_458.up.m_backend.data._M_elems[0x16] = 0;
    local_458.up.m_backend.data._M_elems[0x17] = 0;
    local_458.up.m_backend.data._M_elems[0x18] = 0;
    local_458.up.m_backend.data._M_elems[0x19] = 0;
    local_458.up.m_backend.data._M_elems._104_5_ = 0;
    local_458.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_458.up.m_backend.exp = 0;
    local_458.up.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_458,-(double)local_478);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) &&
        (local_458.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,(cpp_dec_float<200U,_int,_void> *)&local_458), 0 < iVar6)) {
      lVar9 = (long)local_490;
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar2 + lVar9;
      psVar14 = local_130;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
      }
      local_c0 = pnVar2[lVar9].m_backend.exp;
      local_bc = pnVar2[lVar9].m_backend.neg;
      local_b8._0_4_ = pnVar2[lVar9].m_backend.fpclass;
      local_b8._4_4_ = pnVar2[lVar9].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_458,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_48c,(undefined4)local_b8);
      lVar7 = (long)local_490;
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar12 = &local_458;
      pnVar11 = pnVar2 + lVar7;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pLVar12->up).m_backend.data._M_elems[0];
        pLVar12 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar2[lVar7].m_backend.exp = local_458.up.m_backend.exp;
      pnVar2[lVar7].m_backend.neg = local_458.up.m_backend.neg;
      pnVar2[lVar7].m_backend.fpclass = local_458.up.m_backend.fpclass;
      pnVar2[lVar7].m_backend.prec_elem = local_458.up.m_backend.prec_elem;
    }
    uVar5 = local_48c;
    lVar9 = (long)local_490;
    pnVar2 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = pnVar2 + lVar9;
    psVar14 = local_1b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_140 = pnVar2[lVar9].m_backend.exp;
    local_13c = pnVar2[lVar9].m_backend.neg;
    local_138._0_4_ = pnVar2[lVar9].m_backend.fpclass;
    local_138._4_4_ = pnVar2[lVar9].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_458,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_48c,(undefined4)local_138);
    lVar7 = (long)local_490;
    pnVar2 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar12 = &local_458;
    pnVar11 = pnVar2 + lVar7;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pLVar12->up).m_backend.data._M_elems[0];
      pLVar12 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    pnVar2[lVar7].m_backend.exp = local_458.up.m_backend.exp;
    pnVar2[lVar7].m_backend.neg = local_458.up.m_backend.neg;
    pnVar2[lVar7].m_backend.fpclass = local_458.up.m_backend.fpclass;
    pnVar2[lVar7].m_backend.prec_elem = local_458.up.m_backend.prec_elem;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[local_490] = uVar5;
  }
  lVar7 = (long)(local_488->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
  if (0 < lVar7) {
    this_00 = &this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_478 = this;
    do {
      lVar9 = lVar7 + -1;
      iVar6 = (local_488->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[lVar7 + -1].idx;
      if ((char)local_47c != '\0') {
        pNVar3 = (local_488->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pNVar13 = pNVar3 + lVar9;
        psVar14 = local_230;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined4 *)psVar14 = (pNVar13->val).m_backend.data._M_elems[0];
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
          psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
        }
        local_1c0 = pNVar3[lVar9].val.m_backend.exp;
        local_1bc = pNVar3[lVar9].val.m_backend.neg;
        local_1b8._0_4_ = pNVar3[lVar9].val.m_backend.fpclass;
        local_1b8._4_4_ = pNVar3[lVar9].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_458,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((local_478->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar6] + local_48c),
                   CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
        pNVar3 = (local_488->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pLVar12 = &local_458;
        pNVar13 = pNVar3 + lVar9;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pNVar13->val).m_backend.data._M_elems[0] = (pLVar12->up).m_backend.data._M_elems[0];
          pLVar12 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar12 + (ulong)bVar17 * -8 + 4);
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        pNVar3[lVar9].val.m_backend.exp = local_458.up.m_backend.exp;
        pNVar3[lVar9].val.m_backend.neg = local_458.up.m_backend.neg;
        pNVar3[lVar9].val.m_backend.fpclass = local_458.up.m_backend.fpclass;
        pNVar3[lVar9].val.m_backend.prec_elem = local_458.up.m_backend.prec_elem;
        this = local_478;
      }
      pNVar3 = (local_488->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pNVar13 = pNVar3 + lVar9;
      pnVar15 = &local_2b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pNVar13->val).m_backend.data._M_elems[0];
        pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = pNVar3[lVar9].val.m_backend.exp;
      local_2b0.m_backend.neg = pNVar3[lVar9].val.m_backend.neg;
      local_2b0.m_backend.fpclass = pNVar3[lVar9].val.m_backend.fpclass;
      local_2b0.m_backend.prec_elem = pNVar3[lVar9].val.m_backend.prec_elem;
      if ((this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar6) {
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPColBase(&local_458,0);
        iVar16 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        if (iVar16 <= iVar6) {
          iVar16 = (iVar6 - iVar16) + 1;
          do {
            local_460.info = 0;
            local_460.idx = -1;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this_00,&local_460,&local_458);
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
        local_458.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
        this = local_478;
        if (local_458.vec.theelem !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_458.vec.theelem);
          local_458.vec.theelem =
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
          this = local_478;
        }
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(this_00,iVar6,1,&local_490,&local_2b0);
      bVar4 = 1 < lVar7;
      lVar7 = lVar9;
    } while (bVar4);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - local_480));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }